

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::GenerateSwitchStringLookup(Lowerer *this,Instr *instr)

{
  long *plVar1;
  Func *func;
  RegOpnd *baseOpnd;
  LabelInstr *targetLabel;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  uint uVar5;
  undefined4 *puVar6;
  MultiBranchInstr *pMVar7;
  RegOpnd *dst;
  IndirOpnd *src;
  IntConstOpnd *pIVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  Lowerer *this_00;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong local_40;
  
  if (instr->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar3) goto LAB_005b5630;
    *puVar6 = 0;
  }
  pMVar7 = IR::BranchInstr::AsMultiBrInstr((BranchInstr *)instr);
  plVar1 = (long *)pMVar7->m_branchTargets;
  uVar5 = *(uint *)((long)plVar1 + 0x1c);
  if (uVar5 == 0) {
    uVar14 = 0;
    uVar12 = 0xffffffff;
    local_40 = 0;
  }
  else {
    uVar14 = 0;
    uVar12 = 0xffffffff;
    uVar13 = 0;
    uVar11 = 0;
    do {
      iVar10 = *(int *)(*plVar1 + uVar11 * 4);
      if (iVar10 != -1) {
        do {
          lVar9 = (long)iVar10;
          iVar10 = *(int *)(plVar1[1] + 8 + lVar9 * 0x18);
          uVar5 = *(uint *)(*(long *)(plVar1[1] + 0x10 + lVar9 * 0x18) + 0x18);
          if (uVar5 <= uVar12) {
            uVar12 = uVar5;
          }
          if (uVar14 <= uVar5) {
            uVar14 = uVar5;
          }
          if (uVar5 < 0x20) {
            BVUnitT<unsigned_int>::AssertRange(uVar5);
            uVar13 = uVar13 | 1 << (uVar5 & 0x1f);
          }
        } while (iVar10 != -1);
        uVar5 = *(uint *)((long)plVar1 + 0x1c);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar5);
    local_40 = (ulong)uVar13;
  }
  func = instr->m_func;
  dst = IR::RegOpnd::New(TyUint32,func);
  baseOpnd = (RegOpnd *)instr->m_src1;
  OVar4 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005b5630;
    *puVar6 = 0;
  }
  src = IR::IndirOpnd::New(baseOpnd,0x18,TyUint32,func,false);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,instr,true);
  if (instr->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar3) {
LAB_005b5630:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pMVar7 = IR::BranchInstr::AsMultiBrInstr((BranchInstr *)instr);
  targetLabel = *(LabelInstr **)((long)pMVar7->m_branchTargets + 0x38);
  if (uVar12 == uVar14) {
    this_00 = (Lowerer *)(ulong)uVar12;
    pIVar8 = IR::IntConstOpnd::New((IntConstType)this_00,TyUint32,func,false);
    InsertCompareBranch(this_00,&dst->super_Opnd,&pIVar8->super_Opnd,BrNeq_A,false,targetLabel,instr
                        ,false);
  }
  else if (uVar14 < 0x20) {
    pIVar8 = IR::IntConstOpnd::New(local_40,TyUint32,func,false);
    InsertBitTestBranch(this,&pIVar8->super_Opnd,&dst->super_Opnd,false,targetLabel,instr);
    pIVar8 = IR::IntConstOpnd::New(0xffffffe0,TyUint32,func,false);
    InsertTest(&dst->super_Opnd,&pIVar8->super_Opnd,instr);
    InsertBranch(BrNeq_A,false,targetLabel,instr);
  }
  LowerMultiBr(this,instr,HelperOp_SwitchStringLookUp);
  return;
}

Assistant:

void Lowerer::GenerateSwitchStringLookup(IR::Instr * instr)
{
    /* Collect information about string length in all the case*/
    charcount_t minLength = UINT_MAX;
    charcount_t maxLength = 0;
    BVUnit32 bvLength;
    instr->AsBranchInstr()->AsMultiBrInstr()->GetBranchDictionary()->dictionary.Map([&](JITJavascriptString * str, void *)
    {
        charcount_t len = str->GetLength();
        minLength = min(minLength, str->GetLength());
        maxLength = max(maxLength, str->GetLength());
        if (len < 32)
        {
            bvLength.Set(len);
        }
    });

    Func * func = instr->m_func;
    IR::RegOpnd * strLengthOpnd = IR::RegOpnd::New(TyUint32, func);
    InsertMove(strLengthOpnd, IR::IndirOpnd::New(instr->GetSrc1()->AsRegOpnd(), Js::JavascriptString::GetOffsetOfcharLength(), TyUint32, func), instr);
    IR::LabelInstr * defaultLabelInstr = (IR::LabelInstr *)instr->AsBranchInstr()->AsMultiBrInstr()->GetBranchDictionary()->defaultTarget;
    if (minLength == maxLength)
    {
        // Generate single length filter
        InsertCompareBranch(strLengthOpnd, IR::IntConstOpnd::New(minLength, TyUint32, func), Js::OpCode::BrNeq_A, defaultLabelInstr, instr);
    }
    else if (maxLength < 32)
    {
        // Generate bit filter

        // Jump to default label if the bit is not on for the length % 32
        IR::IntConstOpnd * lenBitMaskOpnd = IR::IntConstOpnd::New(bvLength.GetWord(), TyUint32, func);
        InsertBitTestBranch(lenBitMaskOpnd, strLengthOpnd, false, defaultLabelInstr, instr);
        // Jump to default label if the bit is > 32
        InsertTestBranch(strLengthOpnd, IR::IntConstOpnd::New(UINT32_MAX ^ 31, TyUint32, func), Js::OpCode::BrNeq_A, defaultLabelInstr, instr);
    }
    else
    {
        // CONSIDER: Generate range filter
    }
    this->LowerMultiBr(instr, IR::HelperOp_SwitchStringLookUp);
}